

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_Driver::RS_Driver
          (RS_Driver *this,string *filename_start,string *filename_cycle,string *filename_stop,
          bool repeat)

{
  RS_Driver *this_00;
  
  std::ifstream::ifstream(this);
  this_00 = (RS_Driver *)&this->m_ifs_cycle;
  std::ifstream::ifstream(this_00);
  std::ifstream::ifstream(&this->m_ifs_stop);
  this->m_offset = 0.0;
  this->m_time_pose = 0.0;
  this->m_time_hold = 0.0;
  this->m_repeat = repeat;
  this->m_phase = POSE;
  this->m_callback = (PhaseChangeCallback *)0x0;
  this->driven = false;
  this->torque_actuated = false;
  if (filename_cycle->_M_string_length != 0) {
    std::ifstream::open((char *)this_00,(_Ios_Openmode)(filename_cycle->_M_dataplus)._M_p);
    if (filename_start->_M_string_length != 0) {
      std::ifstream::open((char *)this,(_Ios_Openmode)(filename_start->_M_dataplus)._M_p);
      this_00 = this;
    }
    this->m_ifs = &this_00->m_ifs_start;
    if (filename_stop->_M_string_length != 0) {
      std::ifstream::open((char *)&this->m_ifs_stop,(_Ios_Openmode)(filename_stop->_M_dataplus)._M_p
                         );
    }
    LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
    LoadDataLine(this,&this->m_time_2,&this->m_actuations_2);
    return;
  }
  __assert_fail("!filename_cycle.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_models/robot/robosimian/RoboSimian.cpp"
                ,0x2c0,
                "chrono::robosimian::RS_Driver::RS_Driver(const std::string &, const std::string &, const std::string &, bool)"
               );
}

Assistant:

RS_Driver::RS_Driver(const std::string& filename_start,
                     const std::string& filename_cycle,
                     const std::string& filename_stop,
                     bool repeat)
    : m_repeat(repeat), m_time_pose(0), m_time_hold(0), m_offset(0), m_phase(POSE), m_callback(nullptr) {
    assert(!filename_cycle.empty());
    m_ifs_cycle.open(filename_cycle.c_str());

    if (!filename_start.empty()) {
        m_ifs_start.open(filename_start.c_str());
        m_ifs = &m_ifs_start;
    } else {
        m_ifs = &m_ifs_cycle;
    }

    if (!filename_stop.empty()) {
        m_ifs_stop.open(filename_stop.c_str());
    }

    LoadDataLine(m_time_1, m_actuations_1);
    LoadDataLine(m_time_2, m_actuations_2);
}